

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::SyncToSetAndConsumeInst<false>::Exec
          (SyncToSetAndConsumeInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  bool bVar2;
  uint uVar3;
  CharCount CVar4;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar3 = *inputOffset;
  do {
    if (inputLength <= uVar3) {
LAB_00d47f10:
      CVar4 = inputLength;
      if (uVar3 < inputLength) {
        *inputOffset = uVar3 + 1;
        *instPointer = *instPointer + 0x29;
        CVar4 = uVar3;
      }
      *matchStart = CVar4;
      return inputLength <= uVar3;
    }
    bVar2 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[uVar3]);
    if (bVar2) {
      uVar3 = *inputOffset;
      goto LAB_00d47f10;
    }
    if (matcher->stats != (Type)0x0) {
      puVar1 = &matcher->stats->numCompares;
      *puVar1 = *puVar1 + 1;
    }
    uVar3 = *inputOffset + 1;
    *inputOffset = uVar3;
  } while( true );
}

Assistant:

inline bool SyncToSetAndConsumeInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }